

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SteepestDescent.cpp
# Opt level: O1

DynamicVector<double,_std::allocator<double>_> * __thiscall
QuantLib::SteepestDescent::getUpdatedDirection
          (DynamicVector<double,_std::allocator<double>_> *__return_storage_ptr__,
          SteepestDescent *this,Problem *param_1,RealType param_2,
          DynamicVector<double,_std::allocator<double>_> *param_3)

{
  pointer pdVar1;
  pointer pdVar2;
  DynamicVector<double,_std::allocator<double>_> *tmp;
  
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->data_,
             &(((this->super_LineSearchBasedMethod).lineSearch_)->gradient_).data_);
  pdVar1 = (__return_storage_ptr__->data_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pdVar2 = (__return_storage_ptr__->data_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    *pdVar2 = -*pdVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicVector<RealType> SteepestDescent::getUpdatedDirection(
      const Problem&, RealType, const DynamicVector<RealType>&) {
    return -lineSearch_->lastGradient();
  }